

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::anon_unknown_6::ScanLineProcess::run_decode
          (ScanLineProcess *this,exr_const_context_t ctxt,int pn,FrameBuffer *outfb,int fbY,
          int fbLastY,vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *filllist)

{
  int iVar1;
  IoExc *pIVar2;
  byte bVar3;
  undefined4 in_EDX;
  undefined8 in_RSI;
  int *in_RDI;
  vector<Imf_3_4::Slice,_std::allocator<Imf_3_4::Slice>_> *in_stack_00000008;
  int in_stack_00000014;
  FrameBuffer *in_stack_00000018;
  ScanLineProcess *in_stack_00000020;
  bool isfirst;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  FrameBuffer *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  
  *in_RDI = 0x21;
  bVar3 = *(byte *)(in_RDI + 1) & 1;
  if ((*(byte *)(in_RDI + 1) & 1) == 0) {
    iVar1 = exr_decoding_update(in_RSI,in_EDX,in_RDI + 2,in_RDI + 0x12);
    if (iVar1 != 0) {
      pIVar2 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(pIVar2,"Unable to update decode pipeline");
      __cxa_throw(pIVar2,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
    }
  }
  else {
    iVar1 = exr_decoding_initialize(in_RSI,in_EDX,in_RDI + 2,in_RDI + 0x12);
    if (iVar1 != 0) {
      pIVar2 = (IoExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::IoExc::IoExc(pIVar2,"Unable to initialize decode pipeline");
      __cxa_throw(pIVar2,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
    }
    *(undefined1 *)(in_RDI + 1) = 0;
  }
  update_pointers((ScanLineProcess *)CONCAT17(bVar3,in_stack_ffffffffffffffd0),
                  in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0);
  if (((bVar3 & 1) != 0) &&
     (iVar1 = exr_decoding_choose_default_routines(in_RSI,in_EDX,in_RDI + 0x12), iVar1 != 0)) {
    pIVar2 = (IoExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::IoExc::IoExc(pIVar2,"Unable to choose decoder routines");
    __cxa_throw(pIVar2,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
  }
  iVar1 = exr_decoding_run(in_RSI,in_EDX,in_RDI + 0x12);
  *in_RDI = iVar1;
  if (*in_RDI == 0) {
    run_fill(in_stack_00000020,in_stack_00000018,in_stack_00000014,in_stack_00000008);
    return;
  }
  pIVar2 = (IoExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::IoExc::IoExc(pIVar2,"Unable to run decoder");
  __cxa_throw(pIVar2,&Iex_3_4::IoExc::typeinfo,Iex_3_4::IoExc::~IoExc);
}

Assistant:

void ScanLineProcess::run_decode (
    exr_const_context_t ctxt,
    int pn,
    const FrameBuffer *outfb,
    int fbY,
    int fbLastY,
    const std::vector<Slice> &filllist)
{
    last_decode_err = EXR_ERR_UNKNOWN;
    // stash the flag off to make sure to clean up in the event
    // of an exception by changing the flag after init...
    bool isfirst = first;
    if (first)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_initialize (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to initialize decode pipeline");
        }

        first = false;
    }
    else
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_update (ctxt, pn, &cinfo, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to update decode pipeline");
        }
    }

    update_pointers (outfb, fbY, fbLastY);

    if (isfirst)
    {
        if (EXR_ERR_SUCCESS !=
            exr_decoding_choose_default_routines (ctxt, pn, &decoder))
        {
            throw IEX_NAMESPACE::IoExc ("Unable to choose decoder routines");
        }
    }

    last_decode_err = exr_decoding_run (ctxt, pn, &decoder);
    if (EXR_ERR_SUCCESS != last_decode_err)
        throw IEX_NAMESPACE::IoExc ("Unable to run decoder");

    run_fill (outfb, fbY, filllist);
}